

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-internal-inl.h
# Opt level: O2

void __thiscall testing::internal::StreamingListener::Start(StreamingListener *this)

{
  string local_40;
  allocator local_19;
  
  std::__cxx11::string::string((string *)&local_40,"gtest_streaming_protocol_version=1.0",&local_19)
  ;
  SendLn(this,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  return;
}

Assistant:

void Start() { SendLn("gtest_streaming_protocol_version=1.0"); }